

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

NDArray __thiscall tvm::runtime::TVMPODValue_::operator_cast_to_NDArray(TVMPODValue_ *this)

{
  TVMContext TVar1;
  ostream *poVar2;
  char *pcVar3;
  TVMContext *in_RSI;
  LogCheckError _check_err;
  LogCheckError local_1b0;
  LogMessageFatal local_1a8;
  
  if (in_RSI[1].device_type == kDLOpenCL) {
    (this->value_).v_int64 = 0;
  }
  else {
    local_1a8.log_stream_ = (ostringstream)0xd;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>
              ((dmlc *)&local_1b0,(int *)(in_RSI + 1),(anon_enum_32 *)&local_1a8);
    if (local_1b0.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x1d8);
      poVar2 = std::operator<<((ostream *)&local_1a8,"Check failed: ");
      poVar2 = std::operator<<(poVar2,"type_code_ == kNDArrayContainer");
      poVar2 = std::operator<<(poVar2,(string *)local_1b0.str);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2," expected ");
      poVar2 = std::operator<<(poVar2,"NDArrayContainer");
      poVar2 = std::operator<<(poVar2," but get ");
      pcVar3 = TypeCode2Str(in_RSI[1].device_type);
      std::operator<<(poVar2,pcVar3);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
    }
    dmlc::LogCheckError::~LogCheckError(&local_1b0);
    TVar1 = *in_RSI;
    (this->value_).v_ctx = TVar1;
    if (TVar1 != (TVMContext)0x0) {
      LOCK();
      *(int *)((long)TVar1 + 0x44) = *(int *)((long)TVar1 + 0x44) + 1;
      UNLOCK();
    }
  }
  return (NDArray)(Container *)this;
}

Assistant:

operator NDArray() const {
    if (type_code_ == kNull)
      return NDArray();
    TVM_CHECK_TYPE_CODE(type_code_, kNDArrayContainer);
    return NDArray(static_cast<NDArray::Container *>(value_.v_handle));
  }